

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O0

float Abc_SclEvalPerform(SC_Man *p,Vec_Int_t *vCone)

{
  float fVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar3;
  float fVar4;
  float fVar5;
  float local_54;
  int local_34;
  int local_30;
  int k;
  int i;
  float Eval;
  float Multi;
  float Diff;
  Abc_Obj_t *pObj;
  Vec_Int_t *vCone_local;
  SC_Man *p_local;
  
  k = 0;
  local_34 = 0;
  for (local_30 = 0; iVar2 = Vec_IntSize(vCone), local_30 < iVar2; local_30 = local_30 + 1) {
    pNtk = p->pNtk;
    iVar2 = Vec_IntEntry(vCone,local_30);
    pObj_00 = Abc_NtkObj(pNtk,iVar2);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      iVar2 = local_34 + 1;
      fVar4 = Vec_FltEntry(p->vTimes3,local_34);
      pSVar3 = Abc_SclObjTime(p,pObj_00);
      fVar1 = pSVar3->rise;
      local_34 = local_34 + 2;
      fVar5 = Vec_FltEntry(p->vTimes3,iVar2);
      pSVar3 = Abc_SclObjTime(p,pObj_00);
      local_54 = (fVar5 - pSVar3->fall) + (fVar4 - fVar1);
      if (local_54 <= 0.0) {
        local_54 = local_54 * 1.5;
      }
      k = (int)(local_54 * 0.5 + (float)k);
    }
  }
  iVar2 = Vec_FltSize(p->vTimes3);
  if (iVar2 == local_34) {
    iVar2 = Vec_IntSize(vCone);
    return (float)k / (float)iVar2;
  }
  __assert_fail("Vec_FltSize(p->vTimes3) == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                ,0x183,"float Abc_SclEvalPerform(SC_Man *, Vec_Int_t *)");
}

Assistant:

static inline float Abc_SclEvalPerform( SC_Man * p, Vec_Int_t * vCone )
{
    Abc_Obj_t * pObj;
    float Diff, Multi = 1.5, Eval = 0;
    int i, k = 0;
    Abc_NtkForEachObjVec( vCone, p->pNtk, pObj, i )
    {
        Diff  = (Vec_FltEntry(p->vTimes3, k++) - Abc_SclObjTime(p, pObj)->rise);
        Diff += (Vec_FltEntry(p->vTimes3, k++) - Abc_SclObjTime(p, pObj)->fall);
        Eval += 0.5 * (Diff > 0 ? Diff : Multi * Diff);
    }
    assert( Vec_FltSize(p->vTimes3) == k );
    return Eval / Vec_IntSize(vCone);
}